

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# com_util.c
# Opt level: O2

com_core_t * com_core_init(com_seqh_t *seqhdr)

{
  int iVar1;
  int iVar2;
  int iVar3;
  com_core_t *p;
  void *pvVar4;
  com_scu_t *__s;
  long lVar5;
  pel *ppVar6;
  com_sao_param_t (*pacVar7) [3];
  ulong uVar8;
  s8 *psVar9;
  long lVar10;
  size_t __n;
  long lVar11;
  int i_size;
  u8 *__s_00;
  long lVar12;
  long lVar13;
  long lVar14;
  long local_40;
  
  p = (com_core_t *)align_malloc(0x47e8);
  if (p != (com_core_t *)0x0) {
    iVar1 = seqhdr->f_lcu;
    iVar2 = seqhdr->pic_width;
    iVar3 = seqhdr->f_scu * 3 + (iVar2 + seqhdr->f_scu) * 4 + iVar1 * 2;
    i_size = iVar3 + 0x158;
    if (seqhdr->sample_adaptive_offset_enable_flag == '\0') {
      lVar14 = 0;
      local_40 = 0;
      lVar13 = 0;
    }
    else {
      lVar14 = (long)iVar2 + 0x4643;
      i_size = iVar3 + iVar1 * 0x84 + (int)lVar14 + (iVar2 / 2) * 2 + 0x283b;
      local_40 = (long)((iVar2 / 2) * 2 + 0x2686);
      lVar13 = (long)(iVar1 * 0x84);
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag == '\0') {
      lVar11 = 0;
      lVar12 = 0;
    }
    else {
      lVar11 = (long)iVar2 + 0x52c0;
      i_size = i_size + iVar1 * 3 + (int)lVar11 + (iVar2 / 2) * 2 + 0x33dd;
      lVar12 = (long)((iVar2 / 2) * 2 + 0x3380);
    }
    pvVar4 = align_malloc(i_size);
    (p->map).map_base = pvVar4;
    if (pvVar4 != (void *)0x0) {
      __s = (com_scu_t *)((long)pvVar4 + 0x1fU & 0xffffffffffffffe0);
      (p->map).map_scu = __s;
      iVar3 = seqhdr->f_scu;
      memset(__s,0,(long)iVar3);
      lVar5 = (long)seqhdr->i_scu;
      (p->map).map_scu = (p->map).map_scu + lVar5 + 1;
      __n = (size_t)seqhdr->f_scu;
      uVar8 = __n + ((ulong)(__s + (long)iVar3 + 0x1f) & 0xffffffffffffffe0) + 0x1f &
              0xffffffffffffffe0;
      (p->map).map_ipm =
           (s8 *)(lVar5 + ((ulong)(__s + (long)iVar3 + 0x1f) & 0xffffffffffffffe0) + 1);
      __s_00 = (u8 *)(uVar8 + __n * 4 + 0x1f & 0xffffffffffffffe0);
      (p->map).map_pos = (u32 *)(uVar8 + lVar5 * 4 + 4);
      (p->map).map_edge = __s_00;
      memset(__s_00,0,__n);
      (p->map).map_edge = (p->map).map_edge + (long)seqhdr->i_scu + 1;
      (p->map).map_patch = (s8 *)((ulong)(__s_00 + __n + 0x1f) & 0xffffffffffffffe0);
      iVar3 = seqhdr->f_lcu;
      psVar9 = (s8 *)((ulong)((s8 *)((ulong)(__s_00 + __n + 0x1f) & 0xffffffffffffffe0) +
                             (long)iVar3 + 0x1f) & 0xffffffffffffffe0);
      (p->map).map_qp = psVar9;
      ppVar6 = (pel *)((ulong)(psVar9 + (long)iVar3 + 0x1f) & 0xffffffffffffffe0);
      p->linebuf_intra[0] = ppVar6;
      lVar10 = (long)seqhdr->pic_width;
      ppVar6 = (pel *)((ulong)(ppVar6 + lVar10 + 0x1f) & 0xffffffffffffffe0);
      p->linebuf_intra[1] = ppVar6;
      uVar8 = (ulong)(ppVar6 + lVar10 + 0x1f) & 0xffffffffffffffe0;
      lVar5 = uVar8 + lVar10;
      lVar5 = lVar5 - (ulong)((int)lVar5 + 0x20U & 0x1f);
      p->linebuf_sao[0] = (pel *)(uVar8 + 1);
      lVar10 = lVar5 + lVar10;
      ppVar6 = (pel *)((lVar10 - (ulong)((int)lVar10 + 0x41U & 0x1f)) + 0x41);
      p->linebuf_sao[1] = (pel *)(lVar5 + 0x22);
      if (seqhdr->sample_adaptive_offset_enable_flag != '\0') {
        p->sao_src_buf[0] = ppVar6;
        p->sao_src_buf[1] = (pel *)((ulong)(ppVar6 + lVar14 + 0x1f) & 0xffffffffffffffe0);
        pacVar7 = (com_sao_param_t (*) [3])
                  ((ulong)((pel *)((ulong)(ppVar6 + lVar14 + 0x1f) & 0xffffffffffffffe0) +
                          local_40 + 0x1f) & 0xffffffffffffffe0);
        p->sao_param_map = pacVar7;
        ppVar6 = (pel *)((long)(*pacVar7)[0].offset + lVar13 + 7 & 0xffffffffffffffe0);
      }
      if (seqhdr->adaptive_leveling_filter_enable_flag == '\0') {
        return p;
      }
      p->alf_src_buf[0] = ppVar6;
      p->alf_src_buf[1] = (pel *)((ulong)(ppVar6 + lVar11 + 0x1f) & 0xffffffffffffffe0);
      p->alf_enable_map =
           (u8 (*) [3])
           ((ulong)((pel *)((ulong)(ppVar6 + lVar11 + 0x1f) & 0xffffffffffffffe0) + lVar12 + 0x1f) &
           0xffffffffffffffe0);
      return p;
    }
    align_free(p);
  }
  return (com_core_t *)0x0;
}

Assistant:

com_core_t* com_core_init(com_seqh_t *seqhdr)
{
    int total_mem_size = 0;
    u8 *buf;
    com_map_t *map;
    com_core_t *core = com_malloc(sizeof(com_core_t));
    int sao_l_size = 0, sao_c_size = 0, sao_map_size = 0;
    int alf_l_size = 0, alf_c_size = 0, alf_map_size = 0;

    if (core == NULL) {
        return NULL;
    }

    map = &core->map;

    total_mem_size = ALIGN_MASK     + sizeof(com_scu_t) * seqhdr->f_scu +             // map_scu
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_scu +             // map_ipm
                     ALIGN_MASK     + sizeof(      u32) * seqhdr->f_scu +             // map_pos
                     ALIGN_MASK     + sizeof(       u8) * seqhdr->f_scu +             // map_edge
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_patch
                     ALIGN_MASK     + sizeof(       s8) * seqhdr->f_lcu +             // map_qp
                     ALIGN_MASK * 2 + sizeof(pel) * seqhdr->pic_width * 2 +           // linebuf_intra
                     ALIGN_MASK * 2 + sizeof(pel) * (seqhdr->pic_width * 2 + 3) +     // linebuf_sao
                     ALIGN_MASK;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        sao_l_size   = sizeof(pel) * ((MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width + ALIGN_MASK);
        sao_c_size   = sizeof(pel) * ((MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) * (MAX_CU_SIZE / 2 + SAO_SHIFT_PIX_NUM + 2) + seqhdr->pic_width / 2 + ALIGN_MASK) * 2;
        sao_map_size = sizeof(com_sao_param_t) * N_C * seqhdr->f_lcu;
        total_mem_size += sao_l_size + sao_c_size + sao_map_size + ALIGN_MASK * 3;
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        alf_l_size = sizeof(pel) * ((MAX_CU_SIZE + ALIGN_BASIC) * (MAX_CU_SIZE + 4) + seqhdr->pic_width + ALIGN_BASIC * 2);
        alf_c_size = sizeof(pel) * ((MAX_CU_SIZE / 2 + ALIGN_BASIC) * (MAX_CU_SIZE / 2 + 4) + seqhdr->pic_width / 2 + ALIGN_BASIC * 2) * 2;
        alf_map_size = sizeof(u8) * N_C * seqhdr->f_lcu;
        total_mem_size += alf_l_size + alf_c_size + alf_map_size + ALIGN_MASK * 3;
    }

    map->map_base = buf = com_malloc(total_mem_size);

    if (buf == NULL) {
        com_free(core);
        return NULL;
    }

    buf = ALIGN_POINTER(buf);
    GIVE_BUFFERV(map->map_scu,    buf, sizeof(com_scu_t) * seqhdr->f_scu, 0);   map->map_scu    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_ipm,    buf, sizeof(       s8) * seqhdr->f_scu   );   map->map_ipm    += seqhdr->i_scu + 1;
    GIVE_BUFFER (map->map_pos,    buf, sizeof(      u32) * seqhdr->f_scu   );   map->map_pos    += seqhdr->i_scu + 1;
    GIVE_BUFFERV(map->map_edge,   buf, sizeof(       u8) * seqhdr->f_scu, 0);   map->map_edge   += seqhdr->i_scu + 1;

    GIVE_BUFFER(map->map_patch,  buf, sizeof( s8) * seqhdr->f_lcu);
    GIVE_BUFFER(map->map_qp,     buf, sizeof( s8) * seqhdr->f_lcu);

    GIVE_BUFFER(core->linebuf_intra[0], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_intra[1], buf, sizeof(pel) *  seqhdr->pic_width);
    GIVE_BUFFER(core->linebuf_sao  [0], buf, sizeof(pel) * (seqhdr->pic_width + 1)); core->linebuf_sao[0] += 1;
    GIVE_BUFFER(core->linebuf_sao  [1], buf, sizeof(pel) * (seqhdr->pic_width + 2)); core->linebuf_sao[1] += 2;

    if (seqhdr->sample_adaptive_offset_enable_flag) {
        GIVE_BUFFER(core->sao_src_buf[0], buf, sao_l_size);
        GIVE_BUFFER(core->sao_src_buf[1], buf, sao_c_size);
        GIVE_BUFFER(core->sao_param_map,  buf, sao_map_size);
    }
    if (seqhdr->adaptive_leveling_filter_enable_flag) {
        GIVE_BUFFER(core->alf_src_buf[0], buf, alf_l_size);
        GIVE_BUFFER(core->alf_src_buf[1], buf, alf_c_size);
        GIVE_BUFFER(core->alf_enable_map, buf, alf_map_size);
    }
    return core;
}